

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O0

void Bmc_ManBCorePerform(Gia_Man_t *p,Bmc_BCorePar_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  clock_t cVar4;
  sat_solver *s;
  abctime aVar5;
  Vec_Int_t *vVarMap_00;
  Vec_Int_t *pVVar6;
  int *pPivots;
  clock_t cVar7;
  Sto_Man_t *pCnf;
  Intp_Man_t *p_00;
  FILE *local_98;
  abctime local_70;
  Vec_Int_t *vPivots;
  int RetValue;
  void *pSatCnf;
  FILE *pFile;
  sat_solver *pSat;
  Vec_Int_t *vCore;
  Vec_Int_t *vVarMap;
  Intp_Man_t *pManProof;
  clock_t clk;
  Bmc_BCorePar_t *pPars_local;
  Gia_Man_t *p_local;
  
  cVar4 = clock();
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,1000);
  if (pPars->nTimeOut == 0) {
    local_70 = 0;
  }
  else {
    iVar1 = pPars->nTimeOut;
    aVar5 = Abc_Clock();
    local_70 = (long)iVar1 * 1000000 + aVar5;
  }
  sat_solver_set_runtime_limit(s,local_70);
  vVarMap_00 = Bmc_ManBCoreCollect(p,pPars->iFrame,pPars->iOutput,s);
  sat_solver_store_mark_roots(s);
  if (pPars->pFilePivots != (char *)0x0) {
    pVVar6 = Bmc_ManBCoreCollectPivots(p,pPars->pFilePivots,vVarMap_00);
    pPivots = Vec_IntArray(pVVar6);
    iVar1 = Vec_IntSize(pVVar6);
    sat_solver_set_pivot_variables(s,pPivots,iVar1);
    Vec_IntReleaseArray(pVVar6);
    Vec_IntFree(pVVar6);
  }
  iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
  if (iVar1 == 0) {
    Vec_IntFree(vVarMap_00);
    sat_solver_delete(s);
    printf("Timeout of conflict limit is reached.\n");
  }
  else if (iVar1 == 1) {
    Vec_IntFree(vVarMap_00);
    sat_solver_delete(s);
    printf("The BMC problem is SAT.\n");
  }
  else {
    if (pPars->fVerbose != 0) {
      printf("SAT solver returned UNSAT after %7d conflicts.      ",
             (s->stats).conflicts & 0xffffffff);
      cVar7 = clock();
      Abc_PrintTime(1,"Time",cVar7 - cVar4);
    }
    if (iVar1 != -1) {
      __assert_fail("RetValue == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBCore.c"
                    ,0xf1,"void Bmc_ManBCorePerform(Gia_Man_t *, Bmc_BCorePar_t *)");
    }
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    cVar4 = clock();
    p_00 = Intp_ManAlloc();
    pVVar6 = (Vec_Int_t *)Intp_ManUnsatCore(p_00,pCnf,1,pPars->fVerbose);
    Intp_ManFree(p_00);
    if (pPars->fVerbose != 0) {
      uVar2 = Vec_IntSize(pVVar6);
      uVar3 = sat_solver_nconflicts(s);
      printf("UNSAT core contains %d (out of %d) learned clauses.   ",(ulong)uVar2,(ulong)uVar3);
      cVar7 = clock();
      Abc_PrintTime(1,"Time",cVar7 - cVar4);
    }
    Vec_IntSort(pVVar6,0);
    if (pPars->pFileProof == (char *)0x0) {
      local_98 = _stdout;
    }
    else {
      local_98 = fopen(pPars->pFileProof,"wb");
    }
    Intp_ManUnsatCorePrintForBmc((FILE *)local_98,pCnf,pVVar6,vVarMap_00);
    if (local_98 != _stdout) {
      fclose(local_98);
    }
    Sto_ManFree(pCnf);
    Vec_IntFree(vVarMap_00);
    Vec_IntFree(pVVar6);
    sat_solver_delete(s);
  }
  return;
}

Assistant:

void Bmc_ManBCorePerform( Gia_Man_t * p, Bmc_BCorePar_t * pPars )
{
    clock_t clk = clock();
    Intp_Man_t * pManProof;
    Vec_Int_t * vVarMap, * vCore;
    sat_solver * pSat;
    FILE * pFile;
    void * pSatCnf; 
    int RetValue;
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, 1000 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    vVarMap = Bmc_ManBCoreCollect( p, pPars->iFrame, pPars->iOutput, pSat );
    sat_solver_store_mark_roots( pSat ); 
    // create pivot variables
    if ( pPars->pFilePivots )
    {
        Vec_Int_t * vPivots = Bmc_ManBCoreCollectPivots(p, pPars->pFilePivots, vVarMap);
        sat_solver_set_pivot_variables( pSat, Vec_IntArray(vPivots), Vec_IntSize(vPivots) );
        Vec_IntReleaseArray( vPivots );
        Vec_IntFree( vPivots );
    }
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_Undef )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "Timeout of conflict limit is reached.\n" );
        return;
    }
    if ( RetValue == l_True )
    {
        Vec_IntFree( vVarMap );
        sat_solver_delete( pSat );
        printf( "The BMC problem is SAT.\n" );
        return;
    }
    if ( pPars->fVerbose )
    {
        printf( "SAT solver returned UNSAT after %7d conflicts.      ", (int)pSat->stats.conflicts );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
//    Sto_ManDumpClauses( (Sto_Man_t *)pSatCnf, "cnf_store.txt" );
    // derive the UNSAT core
    clk = clock();
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 1, pPars->fVerbose );
    Intp_ManFree( pManProof );
    if ( pPars->fVerbose )
    {
        printf( "UNSAT core contains %d (out of %d) learned clauses.   ", Vec_IntSize(vCore), sat_solver_nconflicts(pSat) );
        Abc_PrintTime( 1, "Time", clock() - clk );
    }
    // write the problem
    Vec_IntSort( vCore, 0 );
    pFile = pPars->pFileProof ? fopen( pPars->pFileProof, "wb" ) : stdout;
    Intp_ManUnsatCorePrintForBmc( pFile, (Sto_Man_t *)pSatCnf, vCore, vVarMap );
    if ( pFile != stdout )
        fclose( pFile );
    // cleanup
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    Vec_IntFree( vVarMap );
    Vec_IntFree( vCore );
    sat_solver_delete( pSat );
}